

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O3

void __thiscall Al::al_exception::al_exception(al_exception *this,string *m,string *f,int l)

{
  uint uVar1;
  pointer pcVar2;
  uint __val;
  uint uVar3;
  undefined8 *puVar4;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  string *local_80;
  string *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  *(undefined ***)this = &PTR__al_exception_00110ca8;
  local_a8 = &(this->msg).field_2;
  (this->msg)._M_dataplus._M_p = (pointer)local_a8;
  pcVar2 = (m->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg,pcVar2,pcVar2 + m->_M_string_length);
  local_80 = &this->file;
  local_b0 = &(this->file).field_2;
  (this->file)._M_dataplus._M_p = (pointer)local_b0;
  pcVar2 = (f->_M_dataplus)._M_p;
  local_78 = &this->msg;
  std::__cxx11::string::_M_construct<char*>((string *)local_80,pcVar2,pcVar2 + f->_M_string_length);
  this->line = l;
  (this->err)._M_dataplus._M_p = (pointer)&(this->err).field_2;
  (this->err)._M_string_length = 0;
  (this->err).field_2._M_local_buf[0] = '\0';
  local_f0 = local_e0;
  pcVar2 = (this->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + (this->file)._M_string_length);
  std::__cxx11::string::append((char *)&local_f0);
  uVar1 = this->line;
  __val = -uVar1;
  if (0 < (int)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar8;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_001092d7;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_001092d7;
      }
      if (uVar6 < 10000) goto LAB_001092d7;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_001092d7:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,(char)__len - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_a0),__len,__val);
  uVar8 = 0xf;
  if (local_f0 != local_e0) {
    uVar8 = local_e0[0];
  }
  if (uVar8 < (ulong)(local_98 + local_e8)) {
    uVar8 = 0xf;
    if (local_a0 != local_90) {
      uVar8 = local_90[0];
    }
    if ((ulong)(local_98 + local_e8) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00109369;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_a0);
LAB_00109369:
  local_d0 = &local_c0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_c0 = *plVar5;
    uStack_b8 = puVar4[3];
  }
  else {
    local_c0 = *plVar5;
    local_d0 = (long *)*puVar4;
  }
  local_c8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_70,(ulong)(this->msg)._M_dataplus._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_40 = *plVar7;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar7;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->err,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return;
}

Assistant:

al_exception(const std::string m, const std::string f, const int l) :
    msg(m), file(f), line(l) {
    err = file + ":" + std::to_string(line) + " - " + msg;
  }